

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAtomic.h
# Opt level: O0

deUint32 deAtomicCompareExchangeUint32(deUint32 *dstAddr,deUint32 compare,deUint32 exchange)

{
  deUint32 dVar1;
  deUint32 exchange_local;
  deUint32 compare_local;
  deUint32 *dstAddr_local;
  
  LOCK();
  dVar1 = *dstAddr;
  if (compare == dVar1) {
    *dstAddr = exchange;
    dVar1 = compare;
  }
  UNLOCK();
  return dVar1;
}

Assistant:

DE_INLINE deUint32 deAtomicCompareExchangeUint32 (volatile deUint32* dstAddr, deUint32 compare, deUint32 exchange)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	return _InterlockedCompareExchange((volatile long*)dstAddr, exchange, compare);
#elif (DE_COMPILER == DE_COMPILER_GCC) || (DE_COMPILER == DE_COMPILER_CLANG)
	return __sync_val_compare_and_swap(dstAddr, compare, exchange);
#else
#	error "Implement deAtomicCompareExchange32()"
#endif
}